

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

ostream * tcu::operator<<(ostream *str,TextureFormat format)

{
  ostream *poVar1;
  
  poVar1 = operator<<(str,format.order);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,format.type);
  poVar1 = std::operator<<(poVar1,"");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, TextureFormat format)
{
	return str << format.order << ", " << format.type << "";
}